

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O3

void helics::loadOptions<toml::basic_value<toml::type_config>>
               (MessageFederate *fed,basic_value<toml::type_config> *data,Endpoint *ept)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *peVar7;
  array_type *paVar8;
  value_type *pvVar9;
  string_type *psVar10;
  enable_if_t<detail::is_exact_toml_type<basic_string<char>,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<basic_string<char,_char_traits<char>,_allocator<char>_>_>_&>
  pbVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  value *element;
  value *element_00;
  basic_value<toml::type_config> *target;
  pointer pbVar14;
  value *section;
  string_view info_00;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view filterName;
  string_view filterName_00;
  string_view filterName_01;
  string_view filterName_02;
  string_view filterName_03;
  string_view filterName_04;
  string_view target_00;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> targets;
  string defTarget;
  string info;
  undefined1 local_390 [16];
  undefined1 local_380 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  undefined1 local_348 [16];
  element_type local_338 [2];
  region local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_298;
  undefined1 local_278 [16];
  undefined1 local_268 [56];
  region local_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_1c8;
  undefined1 local_1b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"flags","");
  local_1b0._0_8_ = ept;
  local_1b0._8_8_ = fed;
  toml::basic_value<toml::type_config>::basic_value((basic_value<toml::type_config> *)local_278);
  local_380._16_8_ = data;
  peVar7 = toml::find_or<toml::type_config,std::__cxx11::string>
                     (data,&local_130,(basic_value<toml::type_config> *)local_278);
  toml::basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)local_348,peVar7);
  if (local_348[0] != empty) {
    if (local_348[0] == array) {
      paVar8 = toml::basic_value<toml::type_config>::as_array
                         ((basic_value<toml::type_config> *)local_348);
      pbVar14 = (paVar8->
                super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (paVar8->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar14 != pbVar2) {
        do {
          peVar7 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                    *)toml::basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar14);
          loadOptions<toml::basic_value<toml::type_config>_>::anon_class_16_2_44194f65::operator()
                    ((anon_class_16_2_44194f65 *)local_1b0,(string *)peVar7);
          pbVar14 = pbVar14 + 1;
        } while (pbVar14 != pbVar2);
      }
    }
    else {
      peVar7 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *
               )toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                          ((basic_value<toml::type_config> *)local_348);
      loadOptions<toml::basic_value<toml::type_config>_>::anon_class_16_2_44194f65::operator()
                ((anon_class_16_2_44194f65 *)local_1b0,(string *)peVar7);
    }
  }
  if ((local_130._M_dataplus._M_p + -1)[local_130._M_string_length] == 's') {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130);
    local_390._8_8_ = 0;
    local_380._0_8_ = local_380._0_8_ & 0xffffffffffffff00;
    local_390._0_8_ = local_380;
    peVar7 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
             toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                       ((basic_value<toml::type_config> *)local_380._16_8_,&local_130,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_390);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)peVar7);
    if (local_390._8_8_ != 0) {
      peVar7 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *
               )local_390;
      loadOptions<toml::basic_value<toml::type_config>_>::anon_class_16_2_44194f65::operator()
                ((anon_class_16_2_44194f65 *)local_1b0,(string *)peVar7);
    }
    if ((undefined1 *)local_390._0_8_ != local_380) {
      peVar7 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *
               )(local_380._0_8_ + 1);
      operator_delete((void *)local_390._0_8_,(ulong)peVar7);
    }
  }
  toml::basic_value<toml::type_config>::cleanup
            ((basic_value<toml::type_config> *)local_348,(EVP_PKEY_CTX *)peVar7);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_298);
  toml::detail::region::~region(&local_300);
  toml::basic_value<toml::type_config>::cleanup
            ((basic_value<toml::type_config> *)local_278,(EVP_PKEY_CTX *)peVar7);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_1c8);
  toml::detail::region::~region(&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  uVar3 = local_380._16_8_;
  local_278._0_8_ = (void *)0x0;
  local_278._8_8_ = 0;
  local_268._8_8_ =
       std::
       _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/MessageFederate.cpp:191:9)>
       ::_M_invoke;
  local_268._0_8_ =
       std::
       _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/MessageFederate.cpp:191:9)>
       ::_M_manager;
  local_348._0_8_ = (element_type *)0x0;
  local_348._8_8_ = 0;
  local_338[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/MessageFederate.cpp:192:9)>
                ::_M_invoke;
  local_338[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/MessageFederate.cpp:192:9)>
                ::_M_manager;
  local_390._8_8_ =
       (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)0x0;
  local_380._8_8_ =
       std::
       _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/MessageFederate.cpp:193:9)>
       ::_M_invoke;
  local_380._0_8_ =
       std::
       _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/MessageFederate.cpp:193:9)>
       ::_M_manager;
  local_390._0_8_ = ept;
  processOptions((value *)local_380._16_8_,
                 (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)local_278,
                 (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)local_348,(function<void_(int,_int)> *)local_390);
  if ((code *)local_380._0_8_ != (code *)0x0) {
    (*(code *)local_380._0_8_)(local_390,local_390,3);
  }
  if ((code *)local_338[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_start != (code *)0x0) {
    (*(code *)local_338[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_start)(local_348,local_348,3);
  }
  if ((code *)local_268._0_8_ != (code *)0x0) {
    (*(code *)local_268._0_8_)(local_278,local_278,3);
  }
  local_278._0_8_ = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"info","");
  bVar5 = toml::basic_value<toml::type_config>::contains
                    ((basic_value<toml::type_config> *)uVar3,(key_type *)local_278);
  if (bVar5) {
    pvVar9 = toml::basic_value<toml::type_config>::at
                       ((basic_value<toml::type_config> *)uVar3,(key_type *)local_278);
    fileops::tomlAsString_abi_cxx11_((string *)local_1b0,(fileops *)pvVar9,element);
  }
  else {
    local_1b0._0_8_ = local_1b0 + 0x10;
    local_1b0._8_8_ = (MessageFederate *)0x0;
    local_1b0[0x10] = '\0';
  }
  if ((undefined1 *)local_278._0_8_ != local_268) {
    operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
  }
  if ((MessageFederate *)local_1b0._8_8_ != (MessageFederate *)0x0) {
    info_00._M_str = (char *)local_1b0._0_8_;
    info_00._M_len = local_1b0._8_8_;
    Interface::setInfo(&ept->super_Interface,info_00);
  }
  local_278._8_8_ = 0;
  local_268._8_8_ =
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/MessageFederate.cpp:199:20)>
       ::_M_invoke;
  local_268._0_8_ =
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/MessageFederate.cpp:199:20)>
       ::_M_manager;
  local_278._0_8_ = ept;
  loadTags((value *)uVar3,
           (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
            *)local_278);
  if ((code *)local_268._0_8_ != (code *)0x0) {
    (*(code *)local_268._0_8_)(local_278,local_278,3);
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"subscriptions","");
  toml::basic_value<toml::type_config>::basic_value((basic_value<toml::type_config> *)local_278);
  peVar7 = toml::find_or<toml::type_config,std::__cxx11::string>
                     ((basic_value<toml::type_config> *)local_380._16_8_,&local_150,
                      (basic_value<toml::type_config> *)local_278);
  toml::basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)local_348,peVar7);
  if (local_348[0] != empty) {
    if (local_348[0] == array) {
      paVar8 = toml::basic_value<toml::type_config>::as_array
                         ((basic_value<toml::type_config> *)local_348);
      pbVar2 = (paVar8->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar14 = (paVar8->
                     super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar2;
          pbVar14 = pbVar14 + 1) {
        psVar10 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar14);
        peVar7 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                  *)psVar10->_M_string_length;
        key._M_str = (psVar10->_M_dataplus)._M_p;
        key._M_len = (size_t)peVar7;
        Endpoint::subscribe(ept,key);
      }
    }
    else {
      psVar10 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                          ((basic_value<toml::type_config> *)local_348);
      peVar7 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *
               )psVar10->_M_string_length;
      key_00._M_str = (psVar10->_M_dataplus)._M_p;
      key_00._M_len = (size_t)peVar7;
      Endpoint::subscribe(ept,key_00);
    }
  }
  if ((local_150._M_dataplus._M_p + -1)[local_150._M_string_length] == 's') {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_150);
    local_390._8_8_ =
         (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)0x0;
    local_380._0_8_ = local_380._0_8_ & 0xffffffffffffff00;
    local_390._0_8_ = (Endpoint *)local_380;
    pbVar11 = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                        ((basic_value<toml::type_config> *)local_380._16_8_,&local_150,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_390);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar11);
    peVar7 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
             local_390._8_8_;
    if ((enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
        local_390._8_8_ !=
        (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)0x0) {
      key_01._M_str = (char *)local_390._0_8_;
      key_01._M_len = local_390._8_8_;
      Endpoint::subscribe(ept,key_01);
    }
    if ((Endpoint *)local_390._0_8_ != (Endpoint *)local_380) {
      peVar7 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *
               )(local_380._0_8_ + 1);
      operator_delete((void *)local_390._0_8_,(ulong)peVar7);
    }
  }
  toml::basic_value<toml::type_config>::cleanup
            ((basic_value<toml::type_config> *)local_348,(EVP_PKEY_CTX *)peVar7);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_298);
  toml::detail::region::~region(&local_300);
  toml::basic_value<toml::type_config>::cleanup
            ((basic_value<toml::type_config> *)local_278,(EVP_PKEY_CTX *)peVar7);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_1c8);
  toml::detail::region::~region(&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"filters","");
  toml::basic_value<toml::type_config>::basic_value((basic_value<toml::type_config> *)local_278);
  peVar7 = toml::find_or<toml::type_config,std::__cxx11::string>
                     ((basic_value<toml::type_config> *)local_380._16_8_,&local_170,
                      (basic_value<toml::type_config> *)local_278);
  toml::basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)local_348,peVar7);
  if (local_348[0] != empty) {
    if (local_348[0] == array) {
      paVar8 = toml::basic_value<toml::type_config>::as_array
                         ((basic_value<toml::type_config> *)local_348);
      pbVar2 = (paVar8->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar14 = (paVar8->
                     super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar2;
          pbVar14 = pbVar14 + 1) {
        psVar10 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar14);
        peVar7 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                  *)psVar10->_M_string_length;
        filterName._M_str = (psVar10->_M_dataplus)._M_p;
        filterName._M_len = (size_t)peVar7;
        Endpoint::addSourceFilter(ept,filterName);
      }
    }
    else {
      psVar10 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                          ((basic_value<toml::type_config> *)local_348);
      peVar7 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *
               )psVar10->_M_string_length;
      filterName_00._M_str = (psVar10->_M_dataplus)._M_p;
      filterName_00._M_len = (size_t)peVar7;
      Endpoint::addSourceFilter(ept,filterName_00);
    }
  }
  if ((local_170._M_dataplus._M_p + -1)[local_170._M_string_length] == 's') {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_170);
    local_390._8_8_ =
         (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)0x0;
    local_380._0_8_ = local_380._0_8_ & 0xffffffffffffff00;
    local_390._0_8_ = (Endpoint *)local_380;
    pbVar11 = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                        ((basic_value<toml::type_config> *)local_380._16_8_,&local_170,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_390);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar11);
    peVar7 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
             local_390._8_8_;
    if ((enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
        local_390._8_8_ !=
        (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)0x0) {
      filterName_01._M_str = (char *)local_390._0_8_;
      filterName_01._M_len = local_390._8_8_;
      Endpoint::addSourceFilter(ept,filterName_01);
    }
    if ((Endpoint *)local_390._0_8_ != (Endpoint *)local_380) {
      peVar7 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *
               )(local_380._0_8_ + 1);
      operator_delete((void *)local_390._0_8_,(ulong)peVar7);
    }
  }
  toml::basic_value<toml::type_config>::cleanup
            ((basic_value<toml::type_config> *)local_348,(EVP_PKEY_CTX *)peVar7);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_298);
  toml::detail::region::~region(&local_300);
  toml::basic_value<toml::type_config>::cleanup
            ((basic_value<toml::type_config> *)local_278,(EVP_PKEY_CTX *)peVar7);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_1c8);
  toml::detail::region::~region(&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_368.field_2;
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"source","");
  section = (value *)local_380._16_8_;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"inputs","");
  local_348._0_8_ = local_338;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_348,local_368._M_dataplus._M_p,
             (undefined1 *)(local_368._M_string_length + (long)local_368._M_dataplus._M_p));
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,"_");
  pbVar12 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348
                      ,local_50._M_dataplus._M_p,local_50._M_string_length);
  local_278._0_8_ = (pbVar12->_M_dataplus)._M_p;
  paVar13 = &pbVar12->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._0_8_ == paVar13) {
    local_268._0_8_ = paVar13->_M_allocated_capacity;
    local_268._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
    local_278._0_8_ = local_268;
  }
  else {
    local_268._0_8_ = paVar13->_M_allocated_capacity;
  }
  local_278._8_8_ = pbVar12->_M_string_length;
  (pbVar12->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar12->_M_string_length = 0;
  (pbVar12->field_2)._M_local_buf[0] = '\0';
  bVar5 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_3_>
                    (section,(string *)local_278,(anon_class_8_1_ba1d4489)ept);
  if ((undefined1 *)local_278._0_8_ != local_268) {
    operator_delete((void *)local_278._0_8_,local_268._0_8_ + 1);
  }
  if ((element_type *)local_348._0_8_ != local_338) {
    operator_delete((void *)local_348._0_8_,
                    (ulong)((long)local_338[0].
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (!bVar5) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   &local_368,&local_50);
    bVar5 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_3_>
                      (section,(string *)local_348,(anon_class_8_1_ba1d4489)ept);
    if ((element_type *)local_348._0_8_ != local_338) {
      operator_delete((void *)local_348._0_8_,
                      (ulong)((long)local_338[0].
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    _Var4._M_p = local_50._M_dataplus._M_p;
    if (!bVar5) {
      iVar6 = toupper((int)*local_50._M_dataplus._M_p);
      section = (value *)local_380._16_8_;
      *_Var4._M_p = (char)iVar6;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390,
                     &local_368,&local_50);
      addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_3_>
                (section,(string *)local_390,(anon_class_8_1_ba1d4489)ept);
      if ((Endpoint *)local_390._0_8_ != (Endpoint *)local_380) {
        operator_delete((void *)local_390._0_8_,(ulong)(local_380._0_8_ + 1));
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._0_8_ + 1);
  }
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"source","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"filters","");
  local_348._0_8_ = local_338;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_348,local_368._M_dataplus._M_p,
             (undefined1 *)(local_368._M_string_length + (long)local_368._M_dataplus._M_p));
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,"_");
  pbVar12 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348
                      ,local_70._M_dataplus._M_p,local_70._M_string_length);
  local_278._0_8_ = (pbVar12->_M_dataplus)._M_p;
  paVar13 = &pbVar12->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._0_8_ == paVar13) {
    local_268._0_8_ = paVar13->_M_allocated_capacity;
    local_268._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
    local_278._0_8_ = local_268;
  }
  else {
    local_268._0_8_ = paVar13->_M_allocated_capacity;
  }
  local_278._8_8_ = pbVar12->_M_string_length;
  (pbVar12->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar12->_M_string_length = 0;
  (pbVar12->field_2)._M_local_buf[0] = '\0';
  bVar5 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_4_>
                    (section,(string *)local_278,(anon_class_8_1_ba1d4489)ept);
  if ((undefined1 *)local_278._0_8_ != local_268) {
    operator_delete((void *)local_278._0_8_,local_268._0_8_ + 1);
  }
  if ((element_type *)local_348._0_8_ != local_338) {
    operator_delete((void *)local_348._0_8_,
                    (ulong)((long)local_338[0].
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (!bVar5) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   &local_368,&local_70);
    bVar5 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_4_>
                      (section,(string *)local_348,(anon_class_8_1_ba1d4489)ept);
    if ((element_type *)local_348._0_8_ != local_338) {
      operator_delete((void *)local_348._0_8_,
                      (ulong)((long)local_338[0].
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    _Var4._M_p = local_70._M_dataplus._M_p;
    if (!bVar5) {
      iVar6 = toupper((int)*local_70._M_dataplus._M_p);
      section = (value *)local_380._16_8_;
      *_Var4._M_p = (char)iVar6;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390,
                     &local_368,&local_70);
      addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_4_>
                (section,(string *)local_390,(anon_class_8_1_ba1d4489)ept);
      if ((Endpoint *)local_390._0_8_ != (Endpoint *)local_380) {
        operator_delete((void *)local_390._0_8_,(ulong)(local_380._0_8_ + 1));
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._0_8_ + 1);
  }
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"destination","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"filters","");
  local_348._0_8_ = local_338;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_348,local_368._M_dataplus._M_p,
             (undefined1 *)(local_368._M_string_length + (long)local_368._M_dataplus._M_p));
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,"_");
  pbVar12 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348
                      ,local_90._M_dataplus._M_p,local_90._M_string_length);
  local_278._0_8_ = (pbVar12->_M_dataplus)._M_p;
  paVar13 = &pbVar12->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._0_8_ == paVar13) {
    local_268._0_8_ = paVar13->_M_allocated_capacity;
    local_268._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
    local_278._0_8_ = local_268;
  }
  else {
    local_268._0_8_ = paVar13->_M_allocated_capacity;
  }
  local_278._8_8_ = pbVar12->_M_string_length;
  (pbVar12->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar12->_M_string_length = 0;
  (pbVar12->field_2)._M_local_buf[0] = '\0';
  bVar5 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_5_>
                    (section,(string *)local_278,(anon_class_8_1_ba1d4489)ept);
  if ((undefined1 *)local_278._0_8_ != local_268) {
    operator_delete((void *)local_278._0_8_,local_268._0_8_ + 1);
  }
  if ((element_type *)local_348._0_8_ != local_338) {
    operator_delete((void *)local_348._0_8_,
                    (ulong)((long)local_338[0].
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (!bVar5) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   &local_368,&local_90);
    bVar5 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_5_>
                      (section,(string *)local_348,(anon_class_8_1_ba1d4489)ept);
    if ((element_type *)local_348._0_8_ != local_338) {
      operator_delete((void *)local_348._0_8_,
                      (ulong)((long)local_338[0].
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    _Var4._M_p = local_90._M_dataplus._M_p;
    if (!bVar5) {
      iVar6 = toupper((int)*local_90._M_dataplus._M_p);
      section = (value *)local_380._16_8_;
      *_Var4._M_p = (char)iVar6;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390,
                     &local_368,&local_90);
      addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_5_>
                (section,(string *)local_390,(anon_class_8_1_ba1d4489)ept);
      if ((Endpoint *)local_390._0_8_ != (Endpoint *)local_380) {
        operator_delete((void *)local_390._0_8_,(ulong)(local_380._0_8_ + 1));
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._0_8_ + 1);
  }
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"source","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"endpoints","");
  local_348._0_8_ = local_338;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_348,local_368._M_dataplus._M_p,
             (undefined1 *)(local_368._M_string_length + (long)local_368._M_dataplus._M_p));
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,"_");
  pbVar12 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348
                      ,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  local_278._0_8_ = (pbVar12->_M_dataplus)._M_p;
  paVar13 = &pbVar12->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._0_8_ == paVar13) {
    local_268._0_8_ = paVar13->_M_allocated_capacity;
    local_268._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
    local_278._0_8_ = local_268;
  }
  else {
    local_268._0_8_ = paVar13->_M_allocated_capacity;
  }
  local_278._8_8_ = pbVar12->_M_string_length;
  (pbVar12->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar12->_M_string_length = 0;
  (pbVar12->field_2)._M_local_buf[0] = '\0';
  bVar5 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_6_>
                    (section,(string *)local_278,(anon_class_8_1_ba1d4489)ept);
  if ((undefined1 *)local_278._0_8_ != local_268) {
    operator_delete((void *)local_278._0_8_,local_268._0_8_ + 1);
  }
  if ((element_type *)local_348._0_8_ != local_338) {
    operator_delete((void *)local_348._0_8_,
                    (ulong)((long)local_338[0].
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (!bVar5) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   &local_368,&local_b0);
    bVar5 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_6_>
                      (section,(string *)local_348,(anon_class_8_1_ba1d4489)ept);
    if ((element_type *)local_348._0_8_ != local_338) {
      operator_delete((void *)local_348._0_8_,
                      (ulong)((long)local_338[0].
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    _Var4._M_p = local_b0._M_dataplus._M_p;
    if (!bVar5) {
      iVar6 = toupper((int)*local_b0._M_dataplus._M_p);
      section = (value *)local_380._16_8_;
      *_Var4._M_p = (char)iVar6;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390,
                     &local_368,&local_b0);
      addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_6_>
                (section,(string *)local_390,(anon_class_8_1_ba1d4489)ept);
      if ((Endpoint *)local_390._0_8_ != (Endpoint *)local_380) {
        operator_delete((void *)local_390._0_8_,(ulong)(local_380._0_8_ + 1));
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._0_8_ + 1);
  }
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"destination","");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"endpoints","");
  local_348._0_8_ = local_338;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_348,local_368._M_dataplus._M_p,
             (undefined1 *)(local_368._M_string_length + (long)local_368._M_dataplus._M_p));
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,"_");
  pbVar12 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348
                      ,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  local_278._0_8_ = (pbVar12->_M_dataplus)._M_p;
  paVar13 = &pbVar12->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._0_8_ == paVar13) {
    local_268._0_8_ = paVar13->_M_allocated_capacity;
    local_268._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
    local_278._0_8_ = local_268;
  }
  else {
    local_268._0_8_ = paVar13->_M_allocated_capacity;
  }
  local_278._8_8_ = pbVar12->_M_string_length;
  (pbVar12->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar12->_M_string_length = 0;
  (pbVar12->field_2)._M_local_buf[0] = '\0';
  bVar5 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_7_>
                    (section,(string *)local_278,(anon_class_8_1_ba1d4489)ept);
  if ((undefined1 *)local_278._0_8_ != local_268) {
    operator_delete((void *)local_278._0_8_,local_268._0_8_ + 1);
  }
  if ((element_type *)local_348._0_8_ != local_338) {
    operator_delete((void *)local_348._0_8_,
                    (ulong)((long)local_338[0].
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (!bVar5) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   &local_368,&local_d0);
    bVar5 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_7_>
                      (section,(string *)local_348,(anon_class_8_1_ba1d4489)ept);
    if ((element_type *)local_348._0_8_ != local_338) {
      operator_delete((void *)local_348._0_8_,
                      (ulong)((long)local_338[0].
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    _Var4._M_p = local_d0._M_dataplus._M_p;
    if (!bVar5) {
      iVar6 = toupper((int)*local_d0._M_dataplus._M_p);
      section = (value *)local_380._16_8_;
      *_Var4._M_p = (char)iVar6;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390,
                     &local_368,&local_d0);
      addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_7_>
                (section,(string *)local_390,(anon_class_8_1_ba1d4489)ept);
      if ((Endpoint *)local_390._0_8_ != (Endpoint *)local_380) {
        operator_delete((void *)local_390._0_8_,(ulong)(local_380._0_8_ + 1));
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._0_8_ + 1);
  }
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"source","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"targets","");
  local_348._0_8_ = local_338;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_348,local_368._M_dataplus._M_p,
             (undefined1 *)(local_368._M_string_length + (long)local_368._M_dataplus._M_p));
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,"_");
  pbVar12 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348
                      ,local_f0._M_dataplus._M_p,local_f0._M_string_length);
  local_278._0_8_ = (pbVar12->_M_dataplus)._M_p;
  paVar13 = &pbVar12->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._0_8_ == paVar13) {
    local_268._0_8_ = paVar13->_M_allocated_capacity;
    local_268._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
    local_278._0_8_ = local_268;
  }
  else {
    local_268._0_8_ = paVar13->_M_allocated_capacity;
  }
  local_278._8_8_ = pbVar12->_M_string_length;
  (pbVar12->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar12->_M_string_length = 0;
  (pbVar12->field_2)._M_local_buf[0] = '\0';
  bVar5 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_8_>
                    (section,(string *)local_278,(anon_class_8_1_ba1d4489)ept);
  if ((undefined1 *)local_278._0_8_ != local_268) {
    operator_delete((void *)local_278._0_8_,local_268._0_8_ + 1);
  }
  if ((element_type *)local_348._0_8_ != local_338) {
    operator_delete((void *)local_348._0_8_,
                    (ulong)((long)local_338[0].
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (!bVar5) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   &local_368,&local_f0);
    bVar5 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_8_>
                      (section,(string *)local_348,(anon_class_8_1_ba1d4489)ept);
    if ((element_type *)local_348._0_8_ != local_338) {
      operator_delete((void *)local_348._0_8_,
                      (ulong)((long)local_338[0].
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    _Var4._M_p = local_f0._M_dataplus._M_p;
    if (!bVar5) {
      iVar6 = toupper((int)*local_f0._M_dataplus._M_p);
      section = (value *)local_380._16_8_;
      *_Var4._M_p = (char)iVar6;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390,
                     &local_368,&local_f0);
      addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_8_>
                (section,(string *)local_390,(anon_class_8_1_ba1d4489)ept);
      if ((Endpoint *)local_390._0_8_ != (Endpoint *)local_380) {
        operator_delete((void *)local_390._0_8_,(ulong)(local_380._0_8_ + 1));
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._0_8_ + 1);
  }
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"destination","");
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"targets","");
  local_348._0_8_ = local_338;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_348,local_368._M_dataplus._M_p,
             (undefined1 *)(local_368._M_string_length + (long)local_368._M_dataplus._M_p));
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,"_");
  pbVar12 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348
                      ,local_110._M_dataplus._M_p,local_110._M_string_length);
  local_278._0_8_ = (pbVar12->_M_dataplus)._M_p;
  paVar13 = &pbVar12->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._0_8_ == paVar13) {
    local_268._0_8_ = paVar13->_M_allocated_capacity;
    local_268._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
    local_278._0_8_ = local_268;
  }
  else {
    local_268._0_8_ = paVar13->_M_allocated_capacity;
  }
  local_278._8_8_ = pbVar12->_M_string_length;
  (pbVar12->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar12->_M_string_length = 0;
  (pbVar12->field_2)._M_local_buf[0] = '\0';
  bVar5 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_9_>
                    (section,(string *)local_278,(anon_class_8_1_ba1d4489)ept);
  if ((undefined1 *)local_278._0_8_ != local_268) {
    operator_delete((void *)local_278._0_8_,local_268._0_8_ + 1);
  }
  if ((element_type *)local_348._0_8_ != local_338) {
    operator_delete((void *)local_348._0_8_,
                    (ulong)((long)local_338[0].
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (!bVar5) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   &local_368,&local_110);
    bVar5 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_9_>
                      (section,(string *)local_348,(anon_class_8_1_ba1d4489)ept);
    if ((element_type *)local_348._0_8_ != local_338) {
      operator_delete((void *)local_348._0_8_,
                      (ulong)((long)local_338[0].
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    _Var4._M_p = local_110._M_dataplus._M_p;
    if (!bVar5) {
      iVar6 = toupper((int)*local_110._M_dataplus._M_p);
      uVar3 = local_380._16_8_;
      *_Var4._M_p = (char)iVar6;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390,
                     &local_368,&local_110);
      addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_9_>
                ((value *)uVar3,(string *)local_390,(anon_class_8_1_ba1d4489)ept);
      if ((Endpoint *)local_390._0_8_ != (Endpoint *)local_380) {
        operator_delete((void *)local_390._0_8_,(ulong)(local_380._0_8_ + 1));
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._0_8_ + 1);
  }
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"destFilters","");
  toml::basic_value<toml::type_config>::basic_value((basic_value<toml::type_config> *)local_278);
  peVar7 = toml::find_or<toml::type_config,std::__cxx11::string>
                     ((basic_value<toml::type_config> *)local_380._16_8_,&local_190,
                      (basic_value<toml::type_config> *)local_278);
  toml::basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)local_348,peVar7);
  if (local_348[0] != empty) {
    if (local_348[0] == array) {
      paVar8 = toml::basic_value<toml::type_config>::as_array
                         ((basic_value<toml::type_config> *)local_348);
      pbVar2 = (paVar8->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar14 = (paVar8->
                     super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar2;
          pbVar14 = pbVar14 + 1) {
        psVar10 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar14);
        peVar7 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                  *)psVar10->_M_string_length;
        filterName_02._M_str = (psVar10->_M_dataplus)._M_p;
        filterName_02._M_len = (size_t)peVar7;
        Endpoint::addDestinationFilter(ept,filterName_02);
      }
    }
    else {
      psVar10 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                          ((basic_value<toml::type_config> *)local_348);
      peVar7 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *
               )psVar10->_M_string_length;
      filterName_03._M_str = (psVar10->_M_dataplus)._M_p;
      filterName_03._M_len = (size_t)peVar7;
      Endpoint::addDestinationFilter(ept,filterName_03);
    }
  }
  if ((local_190._M_dataplus._M_p + -1)[local_190._M_string_length] == 's') {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190);
    local_390._8_8_ =
         (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)0x0;
    local_380._0_8_ = local_380._0_8_ & 0xffffffffffffff00;
    local_390._0_8_ = (Endpoint *)local_380;
    pbVar11 = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                        ((basic_value<toml::type_config> *)local_380._16_8_,&local_190,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_390);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar11);
    peVar7 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
             local_390._8_8_;
    if ((enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
        local_390._8_8_ !=
        (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)0x0) {
      filterName_04._M_str = (char *)local_390._0_8_;
      filterName_04._M_len = local_390._8_8_;
      Endpoint::addDestinationFilter(ept,filterName_04);
    }
    if ((Endpoint *)local_390._0_8_ != (Endpoint *)local_380) {
      peVar7 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *
               )(local_380._0_8_ + 1);
      operator_delete((void *)local_390._0_8_,(ulong)peVar7);
    }
  }
  toml::basic_value<toml::type_config>::cleanup
            ((basic_value<toml::type_config> *)local_348,(EVP_PKEY_CTX *)peVar7);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_298);
  toml::detail::region::~region(&local_300);
  toml::basic_value<toml::type_config>::cleanup
            ((basic_value<toml::type_config> *)local_278,(EVP_PKEY_CTX *)peVar7);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_1c8);
  toml::detail::region::~region(&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  local_348._0_8_ = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"target","");
  uVar3 = local_380._16_8_;
  bVar5 = toml::basic_value<toml::type_config>::contains
                    ((basic_value<toml::type_config> *)local_380._16_8_,(key_type *)local_348);
  if (bVar5) {
    pvVar9 = toml::basic_value<toml::type_config>::at
                       ((basic_value<toml::type_config> *)uVar3,(key_type *)local_348);
    fileops::tomlAsString_abi_cxx11_((string *)local_278,(fileops *)pvVar9,element_00);
  }
  else {
    local_278._8_8_ = 0;
    local_268._0_8_ = local_268._0_8_ & 0xffffffffffffff00;
    local_278._0_8_ = local_268;
  }
  if ((element_type *)local_348._0_8_ != local_338) {
    operator_delete((void *)local_348._0_8_,
                    (ulong)((long)local_338[0].
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 1));
  }
  local_348._0_8_ = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"destination","");
  fileops::replaceIfMember((value *)uVar3,(string *)local_348,(string *)local_278);
  if ((element_type *)local_348._0_8_ != local_338) {
    operator_delete((void *)local_348._0_8_,
                    (ulong)((long)local_338[0].
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (local_278._8_8_ != 0) {
    target_00._M_str = (char *)local_278._0_8_;
    target_00._M_len = local_278._8_8_;
    Endpoint::setDefaultDestination(ept,target_00);
  }
  if ((undefined1 *)local_278._0_8_ != local_268) {
    operator_delete((void *)local_278._0_8_,local_268._0_8_ + 1);
  }
  if ((Endpoint *)local_1b0._0_8_ != (Endpoint *)(local_1b0 + 0x10)) {
    operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
  }
  return;
}

Assistant:

static void loadOptions(MessageFederate* fed, const Inp& data, Endpoint& ept)
{
    using fileops::getOrDefault;
    addTargets(data, "flags", [&ept, fed](const std::string& target) {
        auto oindex = getOptionIndex((target.front() != '-') ? target : target.substr(1));
        const int val = (target.front() != '-') ? 1 : 0;
        if (oindex == HELICS_INVALID_OPTION_INDEX) {
            fed->logWarningMessage(target + " is not a recognized flag");
            return;
        }
        ept.setOption(oindex, val);
    });
    processOptions(
        data,
        [](const std::string& option) { return getOptionIndex(option); },
        [](const std::string& value) { return getOptionValue(value); },
        [&ept](int32_t option, int32_t value) { ept.setOption(option, value); });

    auto info = getOrDefault(data, "info", emptyStr);
    if (!info.empty()) {
        ept.setInfo(info);
    }
    loadTags(data, [&ept](std::string_view tagname, std::string_view tagvalue) {
        ept.setTag(tagname, tagvalue);
    });
    addTargets(data, "subscriptions", [&ept](std::string_view sub) { ept.subscribe(sub); });
    addTargets(data, "filters", [&ept](std::string_view filt) { ept.addSourceFilter(filt); });
    addTargetVariations(data, "source", "inputs", [&ept](std::string_view ipt) {
        ept.subscribe(ipt);
    });
    addTargetVariations(data, "source", "filters", [&ept](std::string_view filt) {
        ept.addSourceFilter(filt);
    });
    addTargetVariations(data, "destination", "filters", [&ept](std::string_view filt) {
        ept.addDestinationFilter(filt);
    });
    addTargetVariations(data, "source", "endpoints", [&ept](std::string_view endpoint) {
        ept.addSourceEndpoint(endpoint);
    });
    addTargetVariations(data, "destination", "endpoints", [&ept](std::string_view endpoint) {
        ept.addDestinationEndpoint(endpoint);
    });
    addTargetVariations(data, "source", "targets", [&ept](std::string_view endpoint) {
        ept.addSourceEndpoint(endpoint);
    });
    addTargetVariations(data, "destination", "targets", [&ept](std::string_view endpoint) {
        ept.addDestinationEndpoint(endpoint);
    });
    addTargets(data, "destFilters", [&ept](std::string_view filt) {
        ept.addDestinationFilter(filt);
    });

    auto defTarget = fileops::getOrDefault(data, "target", emptyStr);
    fileops::replaceIfMember(data, "destination", defTarget);
    if (!defTarget.empty()) {
        ept.setDefaultDestination(defTarget);
    }
}